

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O0

int wrtwrn(FILE *out,char *mess,int isheasarc)

{
  int isheasarc_local;
  char *mess_local;
  FILE *out_local;
  
  if (err_report == 0) {
    if ((heasarc_conv == 0) && (isheasarc != 0)) {
      out_local._4_4_ = 0;
    }
    else {
      nwrns = nwrns + 1;
      strcpy(temp,"*** Warning: ");
      strcat(temp,mess);
      if (isheasarc != 0) {
        strcat(temp," (HEASARC Convention)");
      }
      print_fmt(out,temp,0xd);
      out_local._4_4_ = nwrns;
    }
  }
  else {
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

int wrtwrn(FILE *out, char *mess, int isheasarc)
{
    if(err_report) return 0;           /* Don't print the warnings */    
    if(!heasarc_conv && isheasarc) return 0;  /* heasarc warnings  but with
                                                 heasarc convention turns off */
    nwrns++;
    strcpy(temp,"*** Warning: ");
    strcat(temp,mess);
    if(isheasarc) strcat(temp," (HEASARC Convention)");
    print_fmt(out,temp,13);
/*    if(nwrns > MAXWRNS ) { 
	 fprintf(stderr,"??? Too many Warnings! I give up...\n");
          
    }  */
    return nwrns;
}